

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectionMatrix4.h
# Opt level: O2

void __thiscall
Gs::ProjectionMatrix4T<float>::ToMatrix4(ProjectionMatrix4T<float> *this,Matrix<float,_4UL,_4UL> *m)

{
  m->m_[0] = this->m00;
  m->m_[1] = 0.0;
  m->m_[2] = 0.0;
  m->m_[3] = 0.0;
  m->m_[4] = 0.0;
  m->m_[5] = this->m11;
  m->m_[6] = 0.0;
  m->m_[7] = 0.0;
  m->m_[8] = 0.0;
  m->m_[9] = 0.0;
  m->m_[10] = this->m22;
  m->m_[0xb] = this->m32;
  m->m_[0xc] = 0.0;
  m->m_[0xd] = 0.0;
  m->m_[0xe] = this->m23;
  m->m_[0xf] = this->m33;
  return;
}

Assistant:

void ToMatrix4(Matrix<T, 4, 4>& m) const
        {
            m.At(0, 0) = m00;
            m.At(1, 0) = T(0);
            m.At(2, 0) = T(0);
            m.At(3, 0) = T(0);

            m.At(0, 1) = T(0);
            m.At(1, 1) = m11;
            m.At(2, 1) = T(0);
            m.At(3, 1) = T(0);

            m.At(0, 2) = T(0);
            m.At(1, 2) = T(0);
            m.At(2, 2) = m22;
            m.At(3, 2) = m32;

            m.At(0, 3) = T(0);
            m.At(1, 3) = T(0);
            m.At(2, 3) = m23;
            m.At(3, 3) = m33;
        }